

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O2

void msocket_adapter_udp_msg(void *arg,char *addr,uint16_t port,uint8_t *dataBuf,uint32_t dataLen)

{
  string address;
  allocator<char> local_49;
  string local_48 [32];
  
  if (arg != (void *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_48,addr,&local_49);
    (**(code **)(*arg + 8))(arg,local_48,port,dataBuf,dataLen);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

static void msocket_adapter_udp_msg(void* arg, const char* addr, uint16_t port, const uint8_t* dataBuf, uint32_t dataLen)
{
   auto handler = reinterpret_cast<msocket::Handler*>(arg);
   if (handler != nullptr)
   {
      std::string address{ addr };
      std::size_t size = static_cast<std::size_t>(dataLen);
      handler->udp_message_received(address, port, dataBuf, size);
   }
}